

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::toString(string *__return_storage_ptr__,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string *psVar3;
  char cVar4;
  IMutableContext *pIVar5;
  char *pcVar6;
  ulong uVar7;
  string subs;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  pcVar2 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar2,pcVar2 + value->_M_string_length);
  pIVar5 = getCurrentMutableContext();
  (*(pIVar5->super_IContext)._vptr_IContext[6])(&local_f8);
  cVar4 = (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x58))();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 0x18))();
  }
  local_b8 = __return_storage_ptr__;
  if ((cVar4 != '\0') && (local_d8._M_string_length != 0)) {
    paVar1 = &local_f8.field_2;
    uVar7 = 0;
    do {
      local_f8._M_string_length = 0;
      local_f8.field_2._M_local_buf[0] = '\0';
      local_f8._M_dataplus._M_p = (pointer)paVar1;
      if (local_d8._M_dataplus._M_p[uVar7] == '\t') {
        pcVar6 = "\\t";
LAB_00130235:
        std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)0x0,(ulong)pcVar6);
        if (local_f8._M_string_length != 0) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_d8);
          std::operator+(&local_b0,&local_70,&local_f8);
          uVar7 = uVar7 + 1;
          std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_d8);
          std::operator+(&local_50,&local_b0,&local_90);
          std::__cxx11::string::_M_assign((string *)&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
      }
      else {
        pcVar6 = "\\n";
        if (local_d8._M_dataplus._M_p[uVar7] == '\n') goto LAB_00130235;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < local_d8._M_string_length);
  }
  std::operator+(&local_f8,"\"",&local_d8);
  psVar3 = local_b8;
  (local_b8->_M_dataplus)._M_p = (pointer)&local_b8->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,local_f8._M_dataplus._M_p,
             local_f8._M_dataplus._M_p + local_f8._M_string_length);
  std::__cxx11::string::append((char *)psVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return psVar3;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}